

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_reparent.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  short sVar2;
  char cVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  ALLEGRO_BITMAP *pAVar13;
  char *format;
  bool bVar14;
  bool bVar15;
  undefined4 uVar16;
  double dVar17;
  undefined4 uVar18;
  ALLEGRO_EVENT event;
  
  cVar3 = al_install_system(0x5020700,atexit);
  if (cVar3 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    cVar3 = al_init_image_addon();
    if (cVar3 == '\0') {
      format = "Failed to init IIO addon.\n";
    }
    else {
      al_init_primitives_addon();
      al_set_new_bitmap_flags(0xc0);
      al_set_new_display_flags(0x10);
      example.display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
      if (example.display == (ALLEGRO_DISPLAY *)0x0) {
        format = "Error creating display.\n";
      }
      else {
        cVar3 = al_install_keyboard();
        if (cVar3 == '\0') {
          format = "Error installing keyboard.\n";
        }
        else {
          example.glyphs[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/font.tga");
          if (example.glyphs[0] == (ALLEGRO_BITMAP *)0x0) {
            format = "Error loading data/font.tga\n";
          }
          else {
            example.glyphs[1] = (ALLEGRO_BITMAP *)al_load_bitmap("data/bmpfont.tga");
            if (example.glyphs[1] != (ALLEGRO_BITMAP *)0x0) {
              bVar15 = false;
              example.sub = (ALLEGRO_BITMAP *)al_create_sub_bitmap(example.glyphs[0],0,0,0x20,0x20);
              uVar8 = al_create_timer(0x3f91111111111111);
              uVar9 = al_create_event_queue();
              uVar10 = al_get_keyboard_event_source();
              al_register_event_source(uVar9,uVar10);
              uVar10 = al_get_timer_event_source(uVar8);
              al_register_event_source(uVar9,uVar10);
              uVar10 = al_get_display_event_source(example.display);
              al_register_event_source(uVar9,uVar10);
              al_start_timer(uVar8);
              bVar14 = true;
LAB_001025d0:
              do {
                if (bVar15) {
                  return 0;
                }
                al_get_display_width(example.display);
                al_get_display_height(example.display);
                if (bVar14) {
                  cVar3 = al_is_event_queue_empty(uVar9);
                  bVar14 = true;
                  if (cVar3 != '\0') {
                    al_map_rgb_f(0,0,0);
                    al_clear_to_color();
                    iVar12 = 0;
                    al_draw_bitmap(0,0,example.glyphs[0],0);
                    al_draw_bitmap(0,0x43400000,example.glyphs[1],0);
                    iVar7 = example.p;
                    iVar5 = al_get_bitmap_x(example.sub);
                    iVar6 = al_get_bitmap_y(example.sub);
                    iVar11 = iVar6 + 0xc0;
                    if (iVar7 != 1) {
                      iVar11 = iVar6;
                    }
                    iVar7 = al_get_bitmap_width(example.sub);
                    iVar6 = al_get_bitmap_height(example.sub);
                    uVar18 = 0;
                    uVar16 = al_map_rgba_f(0x3f000000,0,0,0x3f000000);
                    al_draw_filled_rectangle
                              ((float)iVar5,(float)iVar11,(float)(iVar7 + iVar5),
                               (float)(iVar6 + iVar11),uVar16,uVar18);
                    dVar17 = 0.0;
                    for (; iVar12 != 800; iVar12 = iVar12 + 100) {
                      al_draw_scaled_rotated_bitmap
                                (0,0,(float)iVar12,0x43b48000,0x40000000,0x40000000,
                                 (float)(dVar17 * 0.7853981633974483 * 0.125),example.sub,0);
                      dVar17 = dVar17 + 1.0;
                    }
                    al_flip_display();
                    goto LAB_00102771;
                  }
                }
                else {
LAB_00102771:
                  bVar14 = false;
                }
                al_wait_for_event(uVar9);
                if (event.type != 0x2a) {
                  if (event.type == 0x1e) {
                    example.i = example.i + 1;
                    lVar1 = (long)((ulong)(uint)((int)((long)example.i / 4) >> 0x1f) << 0x20 |
                                  (long)example.i / 4 & 0xffffffffU) % 0xc4;
                    sVar2 = (short)lVar1;
                    bVar15 = 0x5f < (int)lVar1;
                    if (bVar15) {
                      uVar4 = sVar2 - 0x60U & 0xff;
                      iVar7 = (uint)(byte)(uVar4 % 0x14) * 0x25;
                      iVar11 = (uint)(byte)(uVar4 / 0x14) * 0x21;
                      uVar8 = 0x25;
                      uVar10 = 0x21;
                      pAVar13 = example.glyphs[1];
                    }
                    else {
                      iVar7 = (int)(sVar2 % 0x10) << 5;
                      iVar11 = (int)(sVar2 / 0x10) << 5;
                      uVar8 = 0x20;
                      uVar10 = 0x20;
                      pAVar13 = example.glyphs[0];
                    }
                    example.p = (int)bVar15;
                    al_reparent_bitmap(example.sub,pAVar13,iVar7,iVar11,uVar8,uVar10);
                    bVar14 = true;
                  }
                  else if (event.type == 0x29) {
                    al_acknowledge_resize(event.any.source);
                  }
                  else if (event.type == 0xb) {
                    bVar15 = event.display.width == 0x3b;
                    goto LAB_001025d0;
                  }
                  bVar15 = false;
                  goto LAB_001025d0;
                }
                bVar15 = true;
              } while( true );
            }
            format = "Error loading data/bmpfont.tga\n";
            example.glyphs[1] = (ALLEGRO_BITMAP *)0x0;
          }
        }
      }
    }
  }
  abort_example(format);
  iVar11 = __cxa_atexit();
  return iVar11;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int w = 800, h = 600;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_primitives_addon();

   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   example.display = al_create_display(w, h);
   if (!example.display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   example.glyphs[0] = al_load_bitmap("data/font.tga");
   if (!example.glyphs[0]) {
      abort_example("Error loading data/font.tga\n");
   }

   example.glyphs[1] = al_load_bitmap("data/bmpfont.tga");
   if (!example.glyphs[1]) {
      abort_example("Error loading data/bmpfont.tga\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(
      example.display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;
      w = al_get_display_width(example.display);
      h = al_get_display_height(example.display);

      if (need_redraw && al_is_event_queue_empty(queue)) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_CHAR:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(event.display.source);
            break;
              
         case ALLEGRO_EVENT_TIMER:
            update();
            need_redraw = true;
            break;
      }
   }

   return 0;
}